

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O0

void __thiscall CornellBox::_calculateGeometry(CornellBox *this)

{
  ColorRGB c;
  ColorRGB c_00;
  ColorRGB c_01;
  ColorRGB c_02;
  ColorRGB c_03;
  ColorRGB c_04;
  ColorRGB c_05;
  ColorRGB c_06;
  ColorRGB c_07;
  ColorRGB c_08;
  Triangle *pTVar1;
  ColorRGB local_440;
  tvec3<float> local_434;
  tvec3<float> local_428;
  tvec3<float> local_41c;
  Triangle *local_410;
  ColorRGB local_408;
  ColorRGB local_3f8;
  tvec3<float> local_3ec;
  tvec3<float> local_3e0;
  tvec3<float> local_3d4;
  Triangle *local_3c8;
  ColorRGB local_3c0;
  ColorRGB local_3b0;
  tvec3<float> local_3a4;
  tvec3<float> local_398;
  tvec3<float> local_38c;
  Triangle *local_380;
  ColorRGB local_378;
  ColorRGB local_368;
  tvec3<float> local_35c;
  tvec3<float> local_350;
  tvec3<float> local_344;
  Triangle *local_338;
  ColorRGB local_330;
  ColorRGB local_320;
  tvec3<float> local_314;
  tvec3<float> local_308;
  tvec3<float> local_2fc;
  Triangle *local_2f0;
  ColorRGB local_2e8;
  ColorRGB local_2d8;
  tvec3<float> local_2cc;
  tvec3<float> local_2c0;
  tvec3<float> local_2b4;
  Triangle *local_2a8;
  ColorRGB local_2a0;
  ColorRGB local_290;
  tvec3<float> local_284;
  tvec3<float> local_278;
  tvec3<float> local_26c;
  Triangle *local_260;
  ColorRGB local_258;
  ColorRGB local_248;
  tvec3<float> local_23c;
  tvec3<float> local_230;
  tvec3<float> local_224;
  Triangle *local_218;
  ColorRGB local_210;
  ColorRGB local_200;
  tvec3<float> local_1f4;
  tvec3<float> local_1e8;
  tvec3<float> local_1dc;
  Triangle *local_1d0;
  ColorRGB local_1c8;
  ColorRGB local_1b8;
  tvec3<float> local_1ac;
  tvec3<float> local_1a0 [2];
  tvec3<float> local_184;
  Triangle *local_178;
  double local_170;
  double local_168;
  double local_160;
  tvec3<float> local_154;
  double local_148;
  double local_140;
  double local_138;
  tvec3<float> local_12c;
  double local_120;
  double local_118;
  double local_110;
  tvec3<float> local_104;
  double local_f8;
  double local_f0;
  double local_e8;
  tvec3<float> local_dc;
  int local_d0 [3];
  tvec3<float> local_c4;
  int local_b8 [3];
  tvec3<float> local_ac;
  int local_a0 [3];
  tvec3<float> local_94;
  int local_88 [3];
  tvec3<float> local_7c;
  int local_70 [3];
  tvec3<float> local_64;
  int local_58 [3];
  tvec3<float> local_4c;
  int local_40 [3];
  tvec3<float> local_34;
  int local_28 [3];
  tvec3<float> local_1c;
  CornellBox *local_10;
  CornellBox *this_local;
  
  local_28[2] = 0;
  local_28[1] = 0;
  local_28[0] = 1;
  local_10 = this;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_1c,local_28 + 2,local_28 + 1,local_28);
  glm::detail::tvec3<float>::operator=(&this->v0,&local_1c);
  local_40[2] = 1;
  local_40[1] = 0;
  local_40[0] = 1;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_34,local_40 + 2,local_40 + 1,local_40);
  glm::detail::tvec3<float>::operator=(&this->v1,&local_34);
  local_58[2] = 0;
  local_58[1] = 1;
  local_58[0] = 1;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_4c,local_58 + 2,local_58 + 1,local_58);
  glm::detail::tvec3<float>::operator=(&this->v2,&local_4c);
  local_70[2] = 1;
  local_70[1] = 1;
  local_70[0] = 1;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_64,local_70 + 2,local_70 + 1,local_70);
  glm::detail::tvec3<float>::operator=(&this->v3,&local_64);
  local_88[2] = 0;
  local_88[1] = 0;
  local_88[0] = -2;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_7c,local_88 + 2,local_88 + 1,local_88);
  glm::detail::tvec3<float>::operator=(&this->v4,&local_7c);
  local_a0[2] = 1;
  local_a0[1] = 0;
  local_a0[0] = -2;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_94,local_a0 + 2,local_a0 + 1,local_a0);
  glm::detail::tvec3<float>::operator=(&this->v5,&local_94);
  local_b8[2] = 0;
  local_b8[1] = 1;
  local_b8[0] = -2;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_ac,local_b8 + 2,local_b8 + 1,local_b8);
  glm::detail::tvec3<float>::operator=(&this->v6,&local_ac);
  local_d0[2] = 1;
  local_d0[1] = 1;
  local_d0[0] = -2;
  glm::detail::tvec3<float>::tvec3<int,int,int>(&local_c4,local_d0 + 2,local_d0 + 1,local_d0);
  glm::detail::tvec3<float>::operator=(&this->v7,&local_c4);
  local_e8 = 0.4;
  local_f0 = 0.99;
  local_f8 = -0.9;
  glm::detail::tvec3<float>::tvec3<double,double,double>(&local_dc,&local_e8,&local_f0,&local_f8);
  glm::detail::tvec3<float>::operator=(&this->l0,&local_dc);
  local_110 = 0.6;
  local_118 = 0.99;
  local_120 = -0.9;
  glm::detail::tvec3<float>::tvec3<double,double,double>
            (&local_104,&local_110,&local_118,&local_120);
  glm::detail::tvec3<float>::operator=(&this->l1,&local_104);
  local_138 = 0.4;
  local_140 = 0.99;
  local_148 = -1.1;
  glm::detail::tvec3<float>::tvec3<double,double,double>
            (&local_12c,&local_138,&local_140,&local_148);
  glm::detail::tvec3<float>::operator=(&this->l2,&local_12c);
  local_160 = 0.6;
  local_168 = 0.99;
  local_170 = -1.1;
  glm::detail::tvec3<float>::tvec3<double,double,double>
            (&local_154,&local_160,&local_168,&local_170);
  glm::detail::tvec3<float>::operator=(&this->l3,&local_154);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_184,&this->v0);
  glm::detail::tvec3<float>::tvec3(local_1a0,&this->v4);
  glm::detail::tvec3<float>::tvec3(&local_1ac,&this->v1);
  ColorRGB::ColorRGB(&local_1b8,0.5,0.5,0.4);
  local_1c8.b = local_1b8.b;
  local_1c8.r = local_1b8.r;
  local_1c8.g = local_1b8.g;
  c_08.b = local_1b8.b;
  c_08.r = local_1b8.r;
  c_08.g = local_1b8.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_184,local_1a0,&local_1ac,
                     c_08);
  local_178 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_178);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_1dc,&this->v1);
  glm::detail::tvec3<float>::tvec3(&local_1e8,&this->v4);
  glm::detail::tvec3<float>::tvec3(&local_1f4,&this->v5);
  ColorRGB::ColorRGB(&local_200,0.5,0.5,0.4);
  local_210.b = local_200.b;
  local_210.r = local_200.r;
  local_210.g = local_200.g;
  c_07.b = local_200.b;
  c_07.r = local_200.r;
  c_07.g = local_200.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_1dc,&local_1e8,&local_1f4
                     ,c_07);
  local_1d0 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_1d0);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_224,&this->v0);
  glm::detail::tvec3<float>::tvec3(&local_230,&this->v2);
  glm::detail::tvec3<float>::tvec3(&local_23c,&this->v4);
  ColorRGB::ColorRGB(&local_248,1.0,0.0,0.0);
  local_258.b = local_248.b;
  local_258.r = local_248.r;
  local_258.g = local_248.g;
  c_06.b = local_248.b;
  c_06.r = local_248.r;
  c_06.g = local_248.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_224,&local_230,&local_23c
                     ,c_06);
  local_218 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_218);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_26c,&this->v2);
  glm::detail::tvec3<float>::tvec3(&local_278,&this->v6);
  glm::detail::tvec3<float>::tvec3(&local_284,&this->v4);
  ColorRGB::ColorRGB(&local_290,1.0,0.0,0.0);
  local_2a0.b = local_290.b;
  local_2a0.r = local_290.r;
  local_2a0.g = local_290.g;
  c_05.b = local_290.b;
  c_05.r = local_290.r;
  c_05.g = local_290.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_26c,&local_278,&local_284
                     ,c_05);
  local_260 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_260);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_2b4,&this->v1);
  glm::detail::tvec3<float>::tvec3(&local_2c0,&this->v5);
  glm::detail::tvec3<float>::tvec3(&local_2cc,&this->v3);
  ColorRGB::ColorRGB(&local_2d8,0.0,1.0,0.0);
  local_2e8.b = local_2d8.b;
  local_2e8.r = local_2d8.r;
  local_2e8.g = local_2d8.g;
  c_04.b = local_2d8.b;
  c_04.r = local_2d8.r;
  c_04.g = local_2d8.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_2b4,&local_2c0,&local_2cc
                     ,c_04);
  local_2a8 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_2fc,&this->v3);
  glm::detail::tvec3<float>::tvec3(&local_308,&this->v5);
  glm::detail::tvec3<float>::tvec3(&local_314,&this->v7);
  ColorRGB::ColorRGB(&local_320,0.0,1.0,0.0);
  local_330.b = local_320.b;
  local_330.r = local_320.r;
  local_330.g = local_320.g;
  c_03.b = local_320.b;
  c_03.r = local_320.r;
  c_03.g = local_320.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_2fc,&local_308,&local_314
                     ,c_03);
  local_2f0 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_2f0);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_344,&this->v2);
  glm::detail::tvec3<float>::tvec3(&local_350,&this->v3);
  glm::detail::tvec3<float>::tvec3(&local_35c,&this->v6);
  ColorRGB::ColorRGB(&local_368,0.5,0.5,0.4);
  local_378.b = local_368.b;
  local_378.r = local_368.r;
  local_378.g = local_368.g;
  c_02.b = local_368.b;
  c_02.r = local_368.r;
  c_02.g = local_368.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_344,&local_350,&local_35c
                     ,c_02);
  local_338 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_338);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_38c,&this->v3);
  glm::detail::tvec3<float>::tvec3(&local_398,&this->v7);
  glm::detail::tvec3<float>::tvec3(&local_3a4,&this->v6);
  ColorRGB::ColorRGB(&local_3b0,0.5,0.5,0.4);
  local_3c0.b = local_3b0.b;
  local_3c0.r = local_3b0.r;
  local_3c0.g = local_3b0.g;
  c_01.b = local_3b0.b;
  c_01.r = local_3b0.r;
  c_01.g = local_3b0.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_38c,&local_398,&local_3a4
                     ,c_01);
  local_380 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_380);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_3d4,&this->v4);
  glm::detail::tvec3<float>::tvec3(&local_3e0,&this->v6);
  glm::detail::tvec3<float>::tvec3(&local_3ec,&this->v5);
  ColorRGB::ColorRGB(&local_3f8,0.5,0.5,0.4);
  local_408.b = local_3f8.b;
  local_408.r = local_3f8.r;
  local_408.g = local_3f8.g;
  c_00.b = local_3f8.b;
  c_00.r = local_3f8.r;
  c_00.g = local_3f8.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_3d4,&local_3e0,&local_3ec
                     ,c_00);
  local_3c8 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_3c8);
  pTVar1 = (Triangle *)operator_new(0x60);
  glm::detail::tvec3<float>::tvec3(&local_41c,&this->v5);
  glm::detail::tvec3<float>::tvec3(&local_428,&this->v6);
  glm::detail::tvec3<float>::tvec3(&local_434,&this->v7);
  ColorRGB::ColorRGB(&local_440,0.5,0.5,0.4);
  c.b = local_440.b;
  c.r = local_440.r;
  c.g = local_440.g;
  Triangle::Triangle(pTVar1,&(this->super_SceneObject).localToWorld,&local_41c,&local_428,&local_434
                     ,c);
  local_410 = pTVar1;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back(&this->triangles,&local_410);
  return;
}

Assistant:

void CornellBox::_calculateGeometry() {
    
    v0 = glm::vec3(0, 0, 1);
    v1 = glm::vec3(1, 0, 1);
    v2 = glm::vec3(0, 1, 1);
    v3 = glm::vec3(1, 1, 1);
    v4 = glm::vec3(0, 0, -2);
    v5 = glm::vec3(1, 0, -2);
    v6 = glm::vec3(0, 1, -2);
    v7 = glm::vec3(1, 1, -2);
    
    l0 = glm::vec3(0.4, 0.99, -0.9);
    l1 = glm::vec3(0.6, 0.99, -0.9);
    l2 = glm::vec3(0.4, 0.99, -1.1);
    l3 = glm::vec3(0.6, 0.99, -1.1);
    
    //bottom
    triangles.push_back(new Triangle(localToWorld, v0, v4, v1, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v1, v4, v5, ColorRGB(0.5, 0.5, 0.4)));
    
    //left
    triangles.push_back(new Triangle(localToWorld, v0, v2, v4, ColorRGB(1.0, 0.0, 0.0)));
    triangles.push_back(new Triangle(localToWorld, v2, v6, v4, ColorRGB(1.0, 0.0, 0.0)));
    
    //right
    triangles.push_back(new Triangle(localToWorld, v1, v5, v3, ColorRGB(0.0, 1.0, 0.0)));
    triangles.push_back(new Triangle(localToWorld, v3, v5, v7, ColorRGB(0.0, 1.0, 0.0)));
    
    //top
    triangles.push_back(new Triangle(localToWorld, v2, v3, v6, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v3, v7, v6, ColorRGB(0.5, 0.5, 0.4)));
    
    //back
    triangles.push_back(new Triangle(localToWorld, v4, v6, v5, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v5, v6, v7, ColorRGB(0.5, 0.5, 0.4)));
    
    //light
//     triangles.push_back(new Triangle(localToWorld, l0, l2, l1, ColorRGB(1.0, 1.0, 1.0)));
//     triangles.push_back(new Triangle(localToWorld, l1, l2, l3, ColorRGB(1.0, 1.0, 1.0)));
}